

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int cmac_multiply_by_u(uchar *output,uchar *input,size_t blocksize)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  
  if (blocksize == 0x10) {
    bVar1 = 0x87;
  }
  else {
    if (blocksize != 8) {
      return -0x6100;
    }
    bVar1 = 0x1b;
  }
  lVar2 = blocksize - 1;
  bVar3 = 0;
  for (uVar4 = blocksize & 0xffffffff; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    output[lVar2] = input[lVar2] * '\x02' | bVar3;
    bVar3 = input[lVar2] >> 7;
    lVar2 = lVar2 + -1;
  }
  output[blocksize - 1] = output[blocksize - 1] ^ (char)*input >> 7 & bVar1;
  return 0;
}

Assistant:

static int cmac_multiply_by_u( unsigned char *output,
                               const unsigned char *input,
                               size_t blocksize )
{
    const unsigned char R_128 = 0x87;
    const unsigned char R_64 = 0x1B;
    unsigned char R_n, mask;
    unsigned char overflow = 0x00;
    int i;

    if( blocksize == MBEDTLS_AES_BLOCK_SIZE )
    {
        R_n = R_128;
    }
    else if( blocksize == MBEDTLS_DES3_BLOCK_SIZE )
    {
        R_n = R_64;
    }
    else
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    for( i = (int)blocksize - 1; i >= 0; i-- )
    {
        output[i] = input[i] << 1 | overflow;
        overflow = input[i] >> 7;
    }

    /* mask = ( input[0] >> 7 ) ? 0xff : 0x00
     * using bit operations to avoid branches */

    /* MSVC has a warning about unary minus on unsigned, but this is
     * well-defined and precisely what we want to do here */
#if defined(_MSC_VER)
#pragma warning( push )
#pragma warning( disable : 4146 )
#endif
    mask = - ( input[0] >> 7 );
#if defined(_MSC_VER)
#pragma warning( pop )
#endif

    output[ blocksize - 1 ] ^= R_n & mask;

    return( 0 );
}